

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbcGlucose.cpp
# Opt level: O3

void Glucose_ReadDimacs(char *pFileName,SimpSolver *s)

{
  vec<Gluco::Lit> *ps;
  byte bVar1;
  int iVar2;
  byte *pbVar3;
  int iVar4;
  byte *pbVar5;
  int iVar6;
  Lit local_4c;
  vec<Gluco::Lit> *local_48;
  byte *local_40;
  vec<Gluco::Lit> *local_38;
  
  pbVar3 = (byte *)Extra_FileReadContents(pFileName);
  if ((s->super_Solver).user_lits.data != (Lit *)0x0) {
    (s->super_Solver).user_lits.sz = 0;
  }
  local_48 = &(s->super_Solver).user_lits;
  local_38 = &(s->super_Solver).add_tmp;
  iVar4 = 0;
  local_40 = pbVar3;
  do {
    bVar1 = *pbVar3;
    if ((bVar1 == 99) || (bVar1 == 0x70)) {
      pbVar3 = pbVar3 + -1;
      do {
        pbVar5 = pbVar3 + 1;
        pbVar3 = pbVar3 + 1;
      } while (*pbVar5 != 10);
    }
    else {
      if (bVar1 == 0) {
        if (local_40 != (byte *)0x0) {
          free(local_40);
        }
        return;
      }
      while( true ) {
        pbVar5 = pbVar3 + 1;
        if (0x2d < bVar1) break;
        if ((0x100002600U >> ((ulong)bVar1 & 0x3f) & 1) == 0) {
          if ((ulong)bVar1 == 0x2d) {
            bVar1 = *pbVar5;
            iVar6 = 1;
            pbVar3 = pbVar5;
            goto LAB_005c1555;
          }
          break;
        }
        bVar1 = *pbVar5;
        pbVar3 = pbVar5;
      }
      iVar6 = 0;
LAB_005c1555:
      iVar2 = atoi((char *)(pbVar3 + (bVar1 == 0x2b)));
      if (iVar2 == 0) {
        if (0 < (s->super_Solver).user_lits.sz) {
          while (ps = local_38, (s->super_Solver).vardata.sz <= iVar4) {
            Gluco::SimpSolver::newVar(s,true,true);
          }
          Gluco::vec<Gluco::Lit>::copyTo(local_48,local_38);
          Gluco::SimpSolver::addClause_(s,ps);
          if ((s->super_Solver).user_lits.data != (Lit *)0x0) {
            (s->super_Solver).user_lits.sz = 0;
          }
        }
      }
      else {
        if (iVar2 < 1) {
          __assert_fail("Var >= 0 && !(c >> 1)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                        ,0x12e,"int Abc_Var2Lit(int, int)");
        }
        if (iVar4 <= iVar2 + -1) {
          iVar4 = iVar2 + -1;
        }
        local_4c.x = iVar6 + iVar2 * 2 + -2;
        Gluco::vec<Gluco::Lit>::push(local_48,&local_4c);
      }
      pbVar3 = pbVar3 + ((ulong)(bVar1 == 0x2b) - 1);
      do {
        pbVar5 = pbVar3 + 1;
        pbVar3 = pbVar3 + 1;
      } while ((byte)(*pbVar5 - 0x30) < 10);
    }
    pbVar3 = pbVar3 + 1;
  } while( true );
}

Assistant:

void Glucose_ReadDimacs( char * pFileName, SimpSolver& s )
{
    vec<Lit> * lits = &s.user_lits;
    char * pBuffer = Extra_FileReadContents( pFileName );
    char * pTemp; int fComp, Var, VarMax = 0;
    lits->clear();
    for ( pTemp = pBuffer; *pTemp; pTemp++ )
    {
        if ( *pTemp == 'c' || *pTemp == 'p' ) {
            while ( *pTemp != '\n' )
                pTemp++;
            continue;
        }
        while ( *pTemp == ' ' || *pTemp == '\t' || *pTemp == '\r' || *pTemp == '\n' )
            pTemp++;
        fComp = 0;
        if ( *pTemp == '-' )
            fComp = 1, pTemp++;
        if ( *pTemp == '+' )
            pTemp++;
        Var = atoi( pTemp );
        if ( Var == 0 ) {
            if ( lits->size() > 0 ) {
                s.addVar( VarMax );
                s.addClause(*lits);
                lits->clear();
            }
        }
        else {
            Var--;
            VarMax = Abc_MaxInt( VarMax, Var );
            lits->push( toLit(Abc_Var2Lit(Var, fComp)) );
        }
        while ( *pTemp >= '0' && *pTemp <= '9' )
            pTemp++;
    }
    ABC_FREE( pBuffer );
}